

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-hash.c
# Opt level: O2

int main(int argc,char **argv)

{
  uint uVar1;
  code *pcVar2;
  double dVar3;
  double dVar4;
  int iVar5;
  uint32_t uVar6;
  int iVar7;
  uint32_t uVar8;
  time_t tVar9;
  sx_alloc *alloc;
  sx_hashtbl *tbl;
  char *pcVar10;
  uint64_t uVar11;
  long *plVar12;
  int i;
  int i_2;
  void *__s;
  uint32_t i_3;
  uint uVar13;
  sx__hashtbl2 *_tbl;
  ulong uVar14;
  char *pcVar15;
  int i_1;
  long lVar16;
  int ii;
  ulong uVar17;
  bool bVar18;
  sx_rng rng;
  
  tVar9 = time((time_t *)0x0);
  sx_rng_seed(&rng,(uint32_t)tVar9);
  sx_tm_init();
  alloc = sx_alloc_malloc();
  tbl = sx_hashtbl_create(alloc,10000);
  if (tbl == (sx_hashtbl *)0x0) {
    sx__debug_message("/workspace/llm4binary/github/license_c_cmakelists/septag[P]sx/tests/test-hash.c"
                      ,0x79,"tbl");
    pcVar2 = (code *)swi(3);
    iVar5 = (*pcVar2)();
    return iVar5;
  }
  pcVar10 = (char *)(*alloc->alloc_cb)((void *)0x0,320000,0,(char *)0x0,(char *)0x0,0,
                                       alloc->user_data);
  if (pcVar10 == (char *)0x0) {
    sx__debug_message("/workspace/llm4binary/github/license_c_cmakelists/septag[P]sx/tests/test-hash.c"
                      ,0x7d,"items");
    pcVar2 = (code *)swi(3);
    iVar5 = (*pcVar2)();
    return iVar5;
  }
  puts("Generating random strings ...");
  pcVar15 = pcVar10;
  for (lVar16 = 0; lVar16 != 10000; lVar16 = lVar16 + 1) {
    uVar6 = sx_rng_gen(&rng);
    uVar14 = (ulong)(uVar6 & 0xf) | 0x10;
    for (uVar17 = 0; uVar14 != uVar17; uVar17 = uVar17 + 1) {
      uVar6 = sx_rng_gen(&rng);
      pcVar15[uVar17] = (char)((ulong)uVar6 % 0x4b) + '0';
    }
    pcVar10[uVar14 + lVar16 * 0x20] = '\0';
    pcVar15 = pcVar15 + 0x20;
  }
  puts("sx_hashtbl:");
  puts("\tPushing into hash table ...");
  uVar11 = sx_tm_now();
  pcVar15 = pcVar10;
  for (lVar16 = 0; lVar16 != 10000; lVar16 = lVar16 + 1) {
    uVar6 = sx_hash_fnv32_str(pcVar15);
    sx_hashtbl_add(tbl,uVar6,(int)lVar16);
    pcVar15 = pcVar15 + 0x20;
  }
  uVar11 = sx_tm_since(uVar11);
  dVar3 = sx_tm_ms(uVar11);
  dVar4 = sx_tm_sec(uVar11);
  printf("\tTook %lf ms (%lf secs)\n",SUB84(dVar3,0),SUB84(dVar4,0));
  puts("\tSearching for random items ...");
  uVar11 = sx_tm_now();
  iVar5 = 10000;
LAB_001045fd:
  do {
    bVar18 = iVar5 == 0;
    iVar5 = iVar5 + -1;
    if (bVar18) {
      uVar11 = sx_tm_since(uVar11);
      dVar3 = sx_tm_ms(uVar11);
      dVar4 = sx_tm_sec(uVar11);
      printf("\tTook %lf ms (%lf secs)\n",SUB84(dVar3,0),SUB84(dVar4,0));
      printf("\tTotal miss count: %d\n\tTotal probe count: %d\n",(ulong)(uint)tbl->_miss_cnt,
             (ulong)(uint)tbl->_probe_cnt);
      plVar12 = (long *)(*alloc->alloc_cb)((void *)0x0,0x19670,0,(char *)0x0,(char *)0x0,0,
                                           alloc->user_data);
      if (plVar12 == (long *)0x0) {
        sx__mem_run_fail_callback
                  ("/workspace/llm4binary/github/license_c_cmakelists/septag[P]sx/tests/test-hash.c"
                   ,0x21);
        sx__debug_message("/workspace/llm4binary/github/license_c_cmakelists/septag[P]sx/tests/test-hash.c"
                          ,0x21,"Out of memory");
        pcVar2 = (code *)swi(3);
        iVar5 = (*pcVar2)();
        return iVar5;
      }
      __s = (void *)((long)plVar12 + 0x27U & 0xfffffffffffffff8);
      *plVar12 = (long)__s;
      plVar12[1] = (long)__s + 0xcb24;
      plVar12[2] = 0x32c900000000;
      plVar12[3] = 0;
      memset(__s,0,0xcb24);
      puts("sx_hashtbl2:");
      puts("\tPushing into hash table ...");
      uVar11 = sx_tm_now();
      for (lVar16 = 0; lVar16 != 10000; lVar16 = lVar16 + 1) {
        uVar6 = sx_hash_fnv32_str(pcVar10 + lVar16 * 0x20);
        if ((int)*(uint *)((long)plVar12 + 0x14) <= (int)plVar12[2]) {
          sx__debug_message("/workspace/llm4binary/github/license_c_cmakelists/septag[P]sx/tests/test-hash.c"
                            ,0x3d,"tbl->count < tbl->capacity");
          pcVar2 = (code *)swi(3);
          iVar5 = (*pcVar2)();
          return iVar5;
        }
        uVar8 = uVar6;
        do {
          uVar14 = (ulong)uVar8 % (ulong)*(uint *)((long)plVar12 + 0x14);
          uVar8 = (int)uVar14 + 1;
        } while (*(int *)(*plVar12 + uVar14 * 4) != 0);
        *(uint32_t *)(*plVar12 + uVar14 * 4) = uVar6;
        *(int *)(plVar12[1] + uVar14 * 4) = (int)lVar16;
        *(int *)(plVar12 + 2) = (int)plVar12[2] + 1;
      }
      uVar11 = sx_tm_since(uVar11);
      dVar3 = sx_tm_ms(uVar11);
      dVar4 = sx_tm_sec(uVar11);
      printf("\tTook %lf ms (%lf secs)\n",SUB84(dVar3,0),SUB84(dVar4,0));
      puts("\tSearching for random items ...");
      uVar11 = sx_tm_now();
      iVar5 = 0;
      do {
        if (iVar5 == 10000) {
          uVar11 = sx_tm_since(uVar11);
          dVar3 = sx_tm_ms(uVar11);
          dVar4 = sx_tm_sec(uVar11);
          printf("\tTook %lf ms (%lf secs)\n",SUB84(dVar3,0),SUB84(dVar4,0));
          printf("\tTotal miss count: %d\n\tTotal probe count: %d\n",(ulong)*(uint *)(plVar12 + 3),
                 (ulong)*(uint *)((long)plVar12 + 0x1c));
          sx_hashtbl_destroy(tbl,alloc);
          plVar12[2] = 0;
          (*alloc->alloc_cb)(plVar12,0,0,(char *)0x0,(char *)0x0,0,alloc->user_data);
          sx_os_getch();
          return 0;
        }
        uVar6 = sx_rng_gen(&rng);
        uVar14 = (ulong)uVar6 % 10000;
        pcVar15 = pcVar10 + (uint)((int)uVar14 << 5);
        uVar6 = sx_hash_fnv32_str(pcVar15);
        uVar1 = *(uint *)((long)plVar12 + 0x14);
        iVar7 = (int)((ulong)uVar6 % (ulong)uVar1);
        if (*(uint32_t *)(*plVar12 + ((ulong)uVar6 % (ulong)uVar1) * 4) == uVar6) {
          lVar16 = (long)iVar7;
        }
        else {
          *(int *)(plVar12 + 3) = (int)plVar12[3] + 1;
          uVar13 = 1;
          do {
            if (uVar1 <= uVar13) goto LAB_0010492b;
            *(int *)((long)plVar12 + 0x1c) = *(int *)((long)plVar12 + 0x1c) + 1;
            lVar16 = (long)(int)((uVar13 + iVar7) % uVar1);
            uVar13 = uVar13 + 1;
          } while (*(uint32_t *)(*plVar12 + lVar16 * 4) != uVar6);
        }
        iVar7 = *(int *)(plVar12[1] + lVar16 * 4);
        if (iVar7 == -1 || iVar7 == (int)uVar14) {
          if (iVar7 == -1) {
LAB_0010492b:
            printf("\tERROR: Item not found: %s (index: %d)\n",pcVar15,uVar14);
          }
        }
        else {
          printf("\tERROR: Invalid hash result:\n\t\tRequested item: %s (index: %d)\n\t\tGot Item: %s (index: %d)\n"
                 ,pcVar15,uVar14);
        }
        iVar5 = iVar5 + 1;
      } while( true );
    }
    uVar6 = sx_rng_gen(&rng);
    uVar14 = (ulong)uVar6 % 10000;
    pcVar15 = pcVar10 + (uint)((int)uVar14 << 5);
    uVar6 = sx_hash_fnv32_str(pcVar15);
    iVar7 = sx_hashtbl_find(tbl,uVar6);
    if (iVar7 == -1) goto LAB_00104679;
    iVar7 = tbl->values[iVar7];
    if (iVar7 == -1 || iVar7 == (int)uVar14) break;
    printf("\tERROR: Invalid hash result:\n\t\tRequested item: %s (index: %d)\n\t\tGot Item: %s (index: %d)\n"
           ,pcVar15,uVar14);
  } while( true );
  if (iVar7 == -1) {
LAB_00104679:
    printf("\tERROR: Item not found: %s (index: %d)\n",pcVar15,uVar14);
  }
  goto LAB_001045fd;
}

Assistant:

int main(int argc, char* argv[])
{
    sx_rng rng;
    sx_rng_seed(&rng, (uint32_t)time(NULL));
    sx_tm_init();

    const int num_samples = 10000;
    const sx_alloc* alloc = sx_alloc_malloc();
    sx_hashtbl* tbl = sx_hashtbl_create(alloc, num_samples);
    sx_assert(tbl);

    // Make random string array
    str_item* items = (str_item*)sx_malloc(alloc, sizeof(str_item) * num_samples);
    sx_assert(items);

    puts("Generating random strings ...");
    for (int i = 0; i < num_samples; i++) {
        str_item* item = &items[i];
        int num_chars = sx_rng_gen_rangei(&rng, 16, sizeof(item->str) - 1);
        for (int ii = 0; ii < num_chars; ii++) {
            char ch = (char)sx_rng_gen_rangei(&rng, 48, 122);
            sx_assert(ch >= 48 && ch <= 122);
            item->str[ii] = ch;
        }
        item->str[num_chars] = 0;
    }

    uint64_t start_tm, delta_tm;
    puts("sx_hashtbl:");
    puts("\tPushing into hash table ...");
    start_tm = sx_tm_now();

    for (int i = 0; i < num_samples; i++) {
        str_item* item = &items[i];
        sx_hashtbl_add(tbl, sx_hash_fnv32_str(item->str), i);
    }

    delta_tm = sx_tm_since(start_tm);
    printf("\tTook %lf ms (%lf secs)\n", sx_tm_ms(delta_tm), sx_tm_sec(delta_tm));

    puts("\tSearching for random items ...");
    start_tm = sx_tm_now();
    for (int i = 0; i < num_samples; i++) {
        int index = sx_rng_gen_rangei(&rng, 0, num_samples - 1);
        int r = sx_hashtbl_find_get(tbl, sx_hash_fnv32_str(items[index].str), -1);
        if (r != index && r != -1) {
            printf(
                "\tERROR: Invalid hash result:\n"
                "\t\tRequested item: %s (index: %d)\n"
                "\t\tGot Item: %s (index: %d)\n",
                items[index].str, index, items[r].str, r);
        } else if (r == -1) {
            printf("\tERROR: Item not found: %s (index: %d)\n", items[index].str, index);
        }
    }
    delta_tm = sx_tm_since(start_tm);
    printf("\tTook %lf ms (%lf secs)\n", sx_tm_ms(delta_tm), sx_tm_sec(delta_tm));
    if (sx_enabled(SX_CONFIG_HASHTBL_DEBUG))
        printf("\tTotal miss count: %d\n\tTotal probe count: %d\n", tbl->_miss_cnt,
               tbl->_probe_cnt);

    ////////////////////////////////////////////////////////////////////////////////////////////////
    // sx__hashtbl2
    sx__hashtbl2* tbl2 = sx__hashtbl2_create(alloc, num_samples);
    sx_assert(tbl2);

    puts("sx_hashtbl2:");
    puts("\tPushing into hash table ...");
    start_tm = sx_tm_now();

    for (int i = 0; i < num_samples; i++) {
        str_item* item = &items[i];
        sx__hashtbl2_add(tbl2, sx_hash_fnv32_str(item->str), i);
    }

    delta_tm = sx_tm_since(start_tm);
    printf("\tTook %lf ms (%lf secs)\n", sx_tm_ms(delta_tm), sx_tm_sec(delta_tm));

    puts("\tSearching for random items ...");
    start_tm = sx_tm_now();
    for (int i = 0; i < num_samples; i++) {
        int index = sx_rng_gen_rangei(&rng, 0, num_samples - 1);
        int r = sx__hashtbl2_find_get(tbl2, sx_hash_fnv32_str(items[index].str), -1);
        if (r != index && r != -1) {
            printf(
                "\tERROR: Invalid hash result:\n"
                "\t\tRequested item: %s (index: %d)\n"
                "\t\tGot Item: %s (index: %d)\n",
                items[index].str, index, items[r].str, r);
        } else if (r == -1) {
            printf("\tERROR: Item not found: %s (index: %d)\n", items[index].str, index);
        }
    }
    delta_tm = sx_tm_since(start_tm);
    printf("\tTook %lf ms (%lf secs)\n", sx_tm_ms(delta_tm), sx_tm_sec(delta_tm));
    if (sx_enabled(SX_CONFIG_HASHTBL_DEBUG))
        printf("\tTotal miss count: %d\n\tTotal probe count: %d\n", tbl2->_miss_cnt,
               tbl2->_probe_cnt);

    sx_hashtbl_destroy(tbl, alloc);
    sx__hashtbl2_destroy(tbl2, alloc);

    sx_os_getch();
    return 0;
}